

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

bool CheckDeprecatedFlags(AActor *actor,PClassActor *info,int index)

{
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this;
  PClass *pPVar1;
  unsigned_short uVar2;
  double *pdVar3;
  PClass *pPVar4;
  bool local_49;
  undefined1 local_40 [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_3e;
  undefined1 local_3c [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_3a;
  undefined1 local_38 [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_36;
  FName local_34 [3];
  double *df;
  PClassActor *pPStack_20;
  int index_local;
  PClassActor *info_local;
  AActor *actor_local;
  
  df._4_4_ = index;
  pPStack_20 = info;
  info_local = (PClassActor *)actor;
  switch(index) {
  case 1:
    actor_local._7_1_ = FName::operator==(&(actor->DamageType).super_FName,NAME_Fire);
    break;
  case 2:
    actor_local._7_1_ = FName::operator==(&(actor->DamageType).super_FName,NAME_Ice);
    break;
  case 3:
    actor_local._7_1_ = actor->Gravity == 0.125;
    break;
  case 4:
    actor_local._7_1_ = actor->meleethreshold == 196.0;
    break;
  case 5:
    actor_local._7_1_ = actor->maxtargetrange == 896.0;
    break;
  case 6:
    pPVar1 = (PClass *)actor[1].super_DThinker.PrevThinker;
    pPVar4 = PClass::FindClass("PickupFlash");
    actor_local._7_1_ = pPVar1 == pPVar4;
    break;
  case 7:
    actor_local._7_1_ = actor->Gravity == 0.25;
    break;
  case 8:
    if (info->DamageFactors == (DmgFactors *)0x0) {
      actor_local._7_1_ = false;
    }
    else {
      this = &info->DamageFactors->
              super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>;
      FName::FName(local_34,NAME_Fire);
      pdVar3 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                         (this,local_34);
      local_49 = false;
      if (pdVar3 != (double *)0x0) {
        local_49 = *pdVar3 == 0.5;
      }
      actor_local._7_1_ = local_49;
    }
    break;
  case 9:
    operator|((EnumType)local_38,BOUNCE_TypeMask);
    TFlags<ActorBounceFlag,_unsigned_short>::operator&(&local_36,&actor->BounceFlags);
    uVar2 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_36);
    actor_local._7_1_ = uVar2 == 0xc6;
    break;
  case 10:
    operator|((EnumType)local_3c,BOUNCE_TypeMask);
    TFlags<ActorBounceFlag,_unsigned_short>::operator&(&local_3a,&actor->BounceFlags);
    uVar2 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_3a);
    actor_local._7_1_ = uVar2 == 0x8f;
    break;
  case 0xb:
    operator|((EnumType)local_40,BOUNCE_TypeMask);
    TFlags<ActorBounceFlag,_unsigned_short>::operator&(&local_3e,&actor->BounceFlags);
    uVar2 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_3e);
    actor_local._7_1_ = uVar2 == 0xaf;
    break;
  case 0xc:
    actor_local._7_1_ = *(int *)&actor[1].super_DThinker.super_DObject.ObjNext == 0;
    break;
  default:
    actor_local._7_1_ = false;
  }
  return actor_local._7_1_;
}

Assistant:

bool CheckDeprecatedFlags(const AActor *actor, PClassActor *info, int index)
{
	// A deprecated flag is false if
	// a) it hasn't been added here
	// b) any property of the actor differs from what it would be after setting the flag using HandleDeprecatedFlags

	// Deprecated flags are normally replaced by something more flexible, which means a multitude of related configurations
	// will report "false".

	switch (index)
	{
	case DEPF_FIREDAMAGE:
		return actor->DamageType == NAME_Fire;
	case DEPF_ICEDAMAGE:
		return actor->DamageType == NAME_Ice;
	case DEPF_LOWGRAVITY:
		return actor->Gravity == 1./8;
	case DEPF_SHORTMISSILERANGE:
		return actor->maxtargetrange == 896.;
	case DEPF_LONGMELEERANGE:
		return actor->meleethreshold == 196.;
	case DEPF_QUARTERGRAVITY:
		return actor->Gravity == 1./4;
	case DEPF_FIRERESIST:
		if (info->DamageFactors)
		{
			double *df = info->DamageFactors->CheckKey(NAME_Fire);
			return df && (*df) == 0.5;
		}
		return false;

	case DEPF_HERETICBOUNCE:
		return (actor->BounceFlags & (BOUNCE_TypeMask|BOUNCE_UseSeeSound)) == BOUNCE_HereticCompat;

	case DEPF_HEXENBOUNCE:
		return (actor->BounceFlags & (BOUNCE_TypeMask|BOUNCE_UseSeeSound)) == BOUNCE_HexenCompat;
	
	case DEPF_DOOMBOUNCE:
		return (actor->BounceFlags & (BOUNCE_TypeMask|BOUNCE_UseSeeSound)) == BOUNCE_DoomCompat;

	case DEPF_PICKUPFLASH:
		return static_cast<const AInventory*>(actor)->PickupFlash == PClass::FindClass("PickupFlash");
		// A pure name lookup may or may not be more efficient, but I know no static identifier for PickupFlash.

	case DEPF_INTERHUBSTRIP:
		return !(static_cast<const AInventory*>(actor)->InterHubAmount);
	}

	return false; // Any entirely unknown flag is not set
}